

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.upb.h
# Opt level: O0

_Bool google_protobuf_FieldOptions_packed(google_protobuf_FieldOptions *msg)

{
  _Bool _Var1;
  void *pvVar2;
  undefined1 local_40 [8];
  upb_MiniTableField field;
  _Bool ret;
  _Bool default_val;
  google_protobuf_FieldOptions *msg_local;
  
  field.presence._1_1_ = 0;
  local_40._0_4_ = 2;
  local_40._4_2_ = 0x10;
  local_40._6_2_ = 0x41;
  field.number_dont_copy_me__upb_internal_use_only = 0x208ffff;
  pvVar2 = (void *)((long)&field.presence + 1);
  unique0x100000f2 = msg;
  _Var1 = upb_MiniTableField_IsExtension((upb_MiniTableField *)local_40);
  if (_Var1) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/internal/accessors.h"
                  ,0x10d,
                  "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                 );
  }
  _Var1 = upb_MiniTableField_IsInOneof((upb_MiniTableField *)local_40);
  if (_Var1) {
LAB_0014d960:
    _Var1 = upb_Message_HasBaseField
                      (&msg->base_dont_copy_me__upb_internal_use_only,(upb_MiniTableField *)local_40
                      );
    if (!_Var1) {
      _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
                ((upb_MiniTableField *)local_40,&field.presence,pvVar2);
      goto LAB_0014d9b1;
    }
  }
  else {
    _Var1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                      ((upb_MiniTableField *)local_40,pvVar2);
    if (!_Var1) goto LAB_0014d960;
  }
  pvVar2 = _upb_Message_DataPtr_dont_copy_me__upb_internal_use_only
                     (&msg->base_dont_copy_me__upb_internal_use_only,(upb_MiniTableField *)local_40)
  ;
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            ((upb_MiniTableField *)local_40,&field.presence,pvVar2);
LAB_0014d9b1:
  return (_Bool)((byte)field.presence & 1);
}

Assistant:

UPB_INLINE bool google_protobuf_FieldOptions_packed(const google_protobuf_FieldOptions* msg) {
  bool default_val = false;
  bool ret;
  const upb_MiniTableField field = {2, 16, 65, kUpb_NoSub, 8, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_1Byte << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}